

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *param_1,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,int num,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *low,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *up)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  uint *puVar2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Real a;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  fpclass_type fVar12;
  int iVar13;
  int32_t *piVar14;
  long lVar15;
  cpp_dec_float<100U,_int,_void> *v;
  cpp_dec_float<100U,_int,_void> *v_00;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  cpp_dec_float<100U,_int,_void> local_298;
  cpp_dec_float<100U,_int,_void> local_248;
  cpp_dec_float<100U,_int,_void> local_1f8;
  cpp_dec_float<100U,_int,_void> local_1a8;
  cpp_dec_float<100U,_int,_void> local_158;
  cpp_dec_float<100U,_int,_void> local_108;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  cpp_dec_float<100U,_int,_void> *local_b0;
  cpp_dec_float<100U,_int,_void> local_a8;
  double local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 0x10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems[6] = 0;
  local_248.data._M_elems[7] = 0;
  local_248.data._M_elems[8] = 0;
  local_248.data._M_elems[9] = 0;
  local_248.data._M_elems[10] = 0;
  local_248.data._M_elems[0xb] = 0;
  local_248.data._M_elems[0xc] = 0;
  local_248.data._M_elems[0xd] = 0;
  local_248.data._M_elems._56_5_ = 0;
  local_248.data._M_elems[0xf]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  local_158.fpclass = cpp_dec_float_finite;
  local_158.prec_elem = 0x10;
  local_158.data._M_elems[0] = 0;
  local_158.data._M_elems[1] = 0;
  local_158.data._M_elems[2] = 0;
  local_158.data._M_elems[3] = 0;
  local_158.data._M_elems[4] = 0;
  local_158.data._M_elems[5] = 0;
  local_158.data._M_elems[6] = 0;
  local_158.data._M_elems[7] = 0;
  local_158.data._M_elems[8] = 0;
  local_158.data._M_elems[9] = 0;
  local_158.data._M_elems[10] = 0;
  local_158.data._M_elems[0xb] = 0;
  local_158.data._M_elems[0xc] = 0;
  local_158.data._M_elems[0xd] = 0;
  local_158.data._M_elems._56_5_ = 0;
  local_158.data._M_elems[0xf]._1_3_ = 0;
  local_158.exp = 0;
  local_158.neg = false;
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 0x10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems[6] = 0;
  local_108.data._M_elems[7] = 0;
  local_108.data._M_elems[8] = 0;
  local_108.data._M_elems[9] = 0;
  local_108.data._M_elems[10] = 0;
  local_108.data._M_elems[0xb] = 0;
  local_108.data._M_elems[0xc] = 0;
  local_108.data._M_elems[0xd] = 0;
  local_108.data._M_elems._56_5_ = 0;
  local_108.data._M_elems[0xf]._1_3_ = 0;
  local_108.exp = 0;
  local_108.neg = false;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 0x10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems[6] = 0;
  local_a8.data._M_elems[7] = 0;
  local_a8.data._M_elems[8] = 0;
  local_a8.data._M_elems[9] = 0;
  local_a8.data._M_elems[10] = 0;
  local_a8.data._M_elems[0xb] = 0;
  local_a8.data._M_elems[0xc] = 0;
  local_a8.data._M_elems[0xd] = 0;
  local_a8.data._M_elems._56_5_ = 0;
  local_a8.data._M_elems[0xf]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_a8,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_158.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_158.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_158.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_158.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_158.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_158.data._M_elems._40_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 10);
  local_158.data._M_elems._48_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xc);
  uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 0xe);
  local_158.data._M_elems._56_5_ = SUB85(uVar3,0);
  local_158.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
  local_158.exp = (val->m_backend).exp;
  local_158.neg = (val->m_backend).neg;
  local_158.fpclass = (val->m_backend).fpclass;
  local_158.prec_elem = (val->m_backend).prec_elem;
  local_b8 = val;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&local_108,0);
  if (num != 0) {
    v_00 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend;
    local_58 = *(double *)(in_FS_OFFSET + -8);
    local_48 = SUB84(local_58,0);
    uStack_50 = 0;
    uStack_44 = (uint)((ulong)local_58 >> 0x20) ^ 0x80000000;
    uStack_40 = 0;
    uStack_3c = 0x80000000;
    lVar15 = (long)num;
    local_b0 = v_00;
    do {
      iVar13 = idx[lVar15 + -1];
      uVar3 = *(undefined8 *)upd[iVar13].m_backend.data._M_elems;
      uVar4 = *(undefined8 *)(upd[iVar13].m_backend.data._M_elems + 2);
      puVar2 = upd[iVar13].m_backend.data._M_elems + 4;
      uVar5 = *(undefined8 *)puVar2;
      uVar6 = *(undefined8 *)(puVar2 + 2);
      puVar2 = upd[iVar13].m_backend.data._M_elems + 8;
      uVar7 = *(undefined8 *)puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      puVar2 = upd[iVar13].m_backend.data._M_elems + 0xc;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      local_248.data._M_elems[0xc] = (uint)uVar9;
      local_248.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
      local_248.data._M_elems._56_5_ = SUB85(uVar10,0);
      local_248.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
      local_248.data._M_elems[8] = (uint)uVar7;
      local_248.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
      local_248.data._M_elems[10] = (uint)uVar8;
      local_248.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
      local_248.data._M_elems[4] = (uint)uVar5;
      local_248.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
      local_248.data._M_elems[6] = (uint)uVar6;
      local_248.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
      local_248.data._M_elems[0] = (uint)uVar3;
      local_248.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
      local_248.data._M_elems[2] = (uint)uVar4;
      local_248.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
      local_248.exp = upd[iVar13].m_backend.exp;
      local_248.neg = upd[iVar13].m_backend.neg;
      local_248.fpclass = upd[iVar13].m_backend.fpclass;
      local_248.prec_elem = upd[iVar13].m_backend.prec_elem;
      if (local_a8.fpclass == cpp_dec_float_NaN || local_248.fpclass == cpp_dec_float_NaN) {
LAB_0047a18f:
        local_298.data._M_elems[0] = local_a8.data._M_elems[0];
        local_298.data._M_elems[1] = local_a8.data._M_elems[1];
        uVar3 = local_298.data._M_elems._0_8_;
        local_298.data._M_elems[2] = local_a8.data._M_elems[2];
        local_298.data._M_elems[3] = local_a8.data._M_elems[3];
        local_298.data._M_elems[0xc] = local_a8.data._M_elems[0xc];
        local_298.data._M_elems[0xd] = local_a8.data._M_elems[0xd];
        local_298.data._M_elems._56_5_ = local_a8.data._M_elems._56_5_;
        local_298.data._M_elems[0xf]._1_3_ = local_a8.data._M_elems[0xf]._1_3_;
        local_298.data._M_elems[8] = local_a8.data._M_elems[8];
        local_298.data._M_elems[9] = local_a8.data._M_elems[9];
        local_298.data._M_elems[10] = local_a8.data._M_elems[10];
        local_298.data._M_elems[0xb] = local_a8.data._M_elems[0xb];
        local_298.data._M_elems[4] = local_a8.data._M_elems[4];
        local_298.data._M_elems[5] = local_a8.data._M_elems[5];
        local_298.data._M_elems[6] = local_a8.data._M_elems[6];
        local_298.data._M_elems[7] = local_a8.data._M_elems[7];
        local_298.exp = local_a8.exp;
        local_298.neg = local_a8.neg;
        local_298.prec_elem = local_a8.prec_elem;
        local_298.fpclass = local_a8.fpclass;
        local_298.data._M_elems[0] = local_a8.data._M_elems[0];
        if (local_298.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
          local_298.neg = (bool)(local_a8.neg ^ 1);
        }
        local_298.data._M_elems._0_8_ = uVar3;
        if (((local_a8.fpclass != cpp_dec_float_NaN) && (local_248.fpclass != cpp_dec_float_NaN)) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_248,&local_298), iVar11 < 0)) {
          local_298.data._M_elems[1] = local_248.data._M_elems[1];
          local_298.data._M_elems[0] = local_248.data._M_elems[0];
          local_298.data._M_elems[3] = local_248.data._M_elems[3];
          local_298.data._M_elems[2] = local_248.data._M_elems[2];
          local_298.data._M_elems[5] = local_248.data._M_elems[5];
          local_298.data._M_elems[4] = local_248.data._M_elems[4];
          local_298.data._M_elems[7] = local_248.data._M_elems[7];
          local_298.data._M_elems[6] = local_248.data._M_elems[6];
          local_298.data._M_elems[9] = local_248.data._M_elems[9];
          local_298.data._M_elems[8] = local_248.data._M_elems[8];
          local_298.data._M_elems[0xb] = local_248.data._M_elems[0xb];
          local_298.data._M_elems[10] = local_248.data._M_elems[10];
          local_298.data._M_elems[0xd] = local_248.data._M_elems[0xd];
          local_298.data._M_elems[0xc] = local_248.data._M_elems[0xc];
          local_298.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
          local_298.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
          local_298.exp = local_248.exp;
          local_298.neg = local_248.neg;
          local_298.fpclass = local_248.fpclass;
          local_298.prec_elem = local_248.prec_elem;
          if (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite) {
            local_298.neg = (bool)(local_248.neg ^ 1);
          }
          if (local_108.fpclass == cpp_dec_float_NaN || local_248.fpclass == cpp_dec_float_NaN) {
LAB_0047a6d0:
            local_1a8.data._M_elems[0] = local_108.data._M_elems[1];
            local_1a8.data._M_elems[1] = local_108.data._M_elems[2];
            local_1a8.data._M_elems[2] = local_108.data._M_elems[3];
            local_1a8.data._M_elems[3] = local_108.data._M_elems[4];
            local_1a8.data._M_elems[4] = local_108.data._M_elems[5];
            local_1a8.data._M_elems[5] = local_108.data._M_elems[6];
            local_1a8.data._M_elems[6] = local_108.data._M_elems[7];
            local_1a8.data._M_elems[7] = local_108.data._M_elems[8];
            local_1a8.data._M_elems[8] = local_108.data._M_elems[9];
            local_1a8.data._M_elems[9] = local_108.data._M_elems[10];
            local_1a8.data._M_elems[10] = local_108.data._M_elems[0xb];
            local_1a8.data._M_elems[0xb] = local_108.data._M_elems[0xc];
            local_1a8.data._M_elems[0xc] = local_108.data._M_elems[0xd];
            local_1a8.data._M_elems[0xd] = local_108.data._M_elems[0xe];
            local_1a8.data._M_elems[0xe] =
                 (uint)(CONCAT35(local_108.data._M_elems[0xf]._1_3_,local_108.data._M_elems._56_5_)
                       >> 0x20);
          }
          else {
            iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_298,&local_108);
            if (iVar11 < 1) {
              goto LAB_0047a6d0;
            }
            local_1a8.data._M_elems[0] = local_248.data._M_elems[1];
            local_1a8.data._M_elems[1] = local_248.data._M_elems[2];
            local_1a8.data._M_elems[2] = local_248.data._M_elems[3];
            local_1a8.data._M_elems[3] = local_248.data._M_elems[4];
            local_1a8.data._M_elems[4] = local_248.data._M_elems[5];
            local_1a8.data._M_elems[5] = local_248.data._M_elems[6];
            local_1a8.data._M_elems[6] = local_248.data._M_elems[7];
            local_1a8.data._M_elems[7] = local_248.data._M_elems[8];
            local_1a8.data._M_elems[8] = local_248.data._M_elems[9];
            local_1a8.data._M_elems[9] = local_248.data._M_elems[10];
            local_1a8.data._M_elems[10] = local_248.data._M_elems[0xb];
            local_1a8.data._M_elems[0xb] = local_248.data._M_elems[0xc];
            local_1a8.data._M_elems[0xc] = local_248.data._M_elems[0xd];
            local_1a8.data._M_elems[0xd] = local_248.data._M_elems[0xe];
            local_1a8.data._M_elems[0xe] =
                 (uint)(CONCAT35(local_248.data._M_elems[0xf]._1_3_,local_248.data._M_elems._56_5_)
                       >> 0x20);
            local_108.data._M_elems[0] = 0;
            local_108.exp = local_248.exp;
            local_108.prec_elem = local_248.prec_elem;
            if (local_248.fpclass == cpp_dec_float_finite && local_248.data._M_elems[0] == 0) {
              local_108.fpclass = cpp_dec_float_finite;
              local_108.neg = local_248.neg;
            }
            else {
              local_108.neg = (bool)(local_248.neg ^ 1);
              local_108.fpclass = local_248.fpclass;
              local_108.data._M_elems[0] = local_248.data._M_elems[0];
            }
          }
          local_108.data._M_elems[0xd] = local_1a8.data._M_elems[0xc];
          local_108.data._M_elems._56_5_ =
               SUB85(CONCAT44(local_1a8.data._M_elems[0xe],local_1a8.data._M_elems[0xd]),0);
          local_108.data._M_elems[0xf]._1_3_ = (undefined3)(local_1a8.data._M_elems[0xe] >> 8);
          local_108.data._M_elems[9] = local_1a8.data._M_elems[8];
          local_108.data._M_elems[10] = local_1a8.data._M_elems[9];
          local_108.data._M_elems[0xb] = local_1a8.data._M_elems[10];
          local_108.data._M_elems[0xc] = local_1a8.data._M_elems[0xb];
          local_108.data._M_elems[5] = local_1a8.data._M_elems[4];
          local_108.data._M_elems[6] = local_1a8.data._M_elems[5];
          local_108.data._M_elems[7] = local_1a8.data._M_elems[6];
          local_108.data._M_elems[8] = local_1a8.data._M_elems[7];
          local_108.data._M_elems[1] = local_1a8.data._M_elems[0];
          local_108.data._M_elems[2] = local_1a8.data._M_elems[1];
          local_108.data._M_elems[3] = local_1a8.data._M_elems[2];
          local_108.data._M_elems[4] = local_1a8.data._M_elems[3];
          pcVar1 = &up[iVar13].m_backend;
          local_1f8.fpclass = cpp_dec_float_finite;
          local_1f8.prec_elem = 0x10;
          local_1f8.data._M_elems[0] = 0;
          local_1f8.data._M_elems[1] = 0;
          local_1f8.data._M_elems[2] = 0;
          local_1f8.data._M_elems[3] = 0;
          local_1f8.data._M_elems[4] = 0;
          local_1f8.data._M_elems[5] = 0;
          local_1f8.data._M_elems[6] = 0;
          local_1f8.data._M_elems[7] = 0;
          local_1f8.data._M_elems[8] = 0;
          local_1f8.data._M_elems[9] = 0;
          local_1f8.data._M_elems[10] = 0;
          local_1f8.data._M_elems[0xb] = 0;
          local_1f8.data._M_elems[0xc] = 0;
          local_1f8.data._M_elems[0xd] = 0;
          local_1f8.data._M_elems._56_5_ = 0;
          local_1f8.data._M_elems[0xf]._1_3_ = 0;
          local_1f8.exp = 0;
          local_1f8.neg = false;
          if (&local_1f8 == &vec[iVar13].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_1f8,pcVar1);
            if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
              local_1f8.neg = (bool)(local_1f8.neg ^ 1);
            }
          }
          else {
            if (&local_1f8 != pcVar1) {
              local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
              local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
              local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
              local_1f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
              local_1f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
              local_1f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
              local_1f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
              uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
              local_1f8.data._M_elems._56_5_ = SUB85(uVar3,0);
              local_1f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_1f8.exp = pcVar1->exp;
              local_1f8.neg = pcVar1->neg;
              local_1f8.fpclass = pcVar1->fpclass;
              local_1f8.prec_elem = pcVar1->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_1f8,&vec[iVar13].m_backend);
          }
          v_00 = local_b0;
          local_1a8.fpclass = cpp_dec_float_finite;
          local_1a8.prec_elem = 0x10;
          local_1a8.data._M_elems[0] = 0;
          local_1a8.data._M_elems[1] = 0;
          local_1a8.data._M_elems[2] = 0;
          local_1a8.data._M_elems[3] = 0;
          local_1a8.data._M_elems[4] = 0;
          local_1a8.data._M_elems[5] = 0;
          local_1a8.data._M_elems[6] = 0;
          local_1a8.data._M_elems[7] = 0;
          local_1a8.data._M_elems[8] = 0;
          local_1a8.data._M_elems[9] = 0;
          local_1a8.data._M_elems[10] = 0;
          local_1a8.data._M_elems[0xb] = 0;
          local_1a8.data._M_elems[0xc] = 0;
          local_1a8.data._M_elems[0xd] = 0;
          local_1a8.data._M_elems[0xe] = 0;
          local_1a8.data._M_elems[0xf] = 0;
          local_1a8.exp = 0;
          local_1a8.neg = false;
          v = &local_1f8;
          if (&local_1a8 != local_b0) {
            local_1a8.data._M_elems[0xc] = local_1f8.data._M_elems[0xc];
            local_1a8.data._M_elems[0xd] = local_1f8.data._M_elems[0xd];
            local_1a8.data._M_elems[0xe] = local_1f8.data._M_elems[0xe];
            local_1a8.data._M_elems[0xf] =
                 (uint)(CONCAT35(local_1f8.data._M_elems[0xf]._1_3_,local_1f8.data._M_elems._56_5_)
                       >> 0x20);
            local_1a8.data._M_elems[8] = local_1f8.data._M_elems[8];
            local_1a8.data._M_elems[9] = local_1f8.data._M_elems[9];
            local_1a8.data._M_elems[10] = local_1f8.data._M_elems[10];
            local_1a8.data._M_elems[0xb] = local_1f8.data._M_elems[0xb];
            local_1a8.data._M_elems[4] = local_1f8.data._M_elems[4];
            local_1a8.data._M_elems[5] = local_1f8.data._M_elems[5];
            local_1a8.data._M_elems[6] = local_1f8.data._M_elems[6];
            local_1a8.data._M_elems[7] = local_1f8.data._M_elems[7];
            local_1a8.data._M_elems[0] = local_1f8.data._M_elems[0];
            local_1a8.data._M_elems[1] = local_1f8.data._M_elems[1];
            local_1a8.data._M_elems[2] = local_1f8.data._M_elems[2];
            local_1a8.data._M_elems[3] = local_1f8.data._M_elems[3];
            local_1a8.exp = local_1f8.exp;
            local_1a8.neg = local_1f8.neg;
            local_1a8.fpclass = local_1f8.fpclass;
            local_1a8.prec_elem = local_1f8.prec_elem;
            v = local_b0;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(&local_1a8,v);
          local_298.fpclass = cpp_dec_float_finite;
          local_298.prec_elem = 0x10;
          local_298.data._M_elems[0] = 0;
          local_298.data._M_elems[1] = 0;
          local_298.data._M_elems[2] = 0;
          local_298.data._M_elems[3] = 0;
          local_298.data._M_elems[4] = 0;
          local_298.data._M_elems[5] = 0;
          local_298.data._M_elems[6] = 0;
          local_298.data._M_elems[7] = 0;
          local_298.data._M_elems[8] = 0;
          local_298.data._M_elems[9] = 0;
          local_298.data._M_elems[10] = 0;
          local_298.data._M_elems[0xb] = 0;
          local_298.data._M_elems[0xc] = 0;
          local_298.data._M_elems[0xd] = 0;
          local_298.data._M_elems._56_5_ = 0;
          local_298.data._M_elems[0xf]._1_3_ = 0;
          local_298.exp = 0;
          local_298.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_298,&local_1a8,&local_248);
          local_248.data._M_elems[0xc] = local_298.data._M_elems[0xc];
          local_248.data._M_elems[0xd] = local_298.data._M_elems[0xd];
          local_248.data._M_elems._56_5_ = local_298.data._M_elems._56_5_;
          local_248.data._M_elems[0xf]._1_3_ = local_298.data._M_elems[0xf]._1_3_;
          local_248.data._M_elems[8] = local_298.data._M_elems[8];
          local_248.data._M_elems[9] = local_298.data._M_elems[9];
          local_248.data._M_elems[10] = local_298.data._M_elems[10];
          local_248.data._M_elems[0xb] = local_298.data._M_elems[0xb];
          local_248.data._M_elems[4] = local_298.data._M_elems[4];
          local_248.data._M_elems[5] = local_298.data._M_elems[5];
          local_248.data._M_elems[6] = local_298.data._M_elems[6];
          local_248.data._M_elems[7] = local_298.data._M_elems[7];
          local_248.data._M_elems[0] = local_298.data._M_elems[0];
          local_248.data._M_elems[1] = local_298.data._M_elems[1];
          local_248.data._M_elems[2] = local_298.data._M_elems[2];
          local_248.data._M_elems[3] = local_298.data._M_elems[3];
          local_248.exp = local_298.exp;
          local_248.neg = local_298.neg;
          local_248.fpclass = local_298.fpclass;
          local_248.prec_elem = local_298.prec_elem;
          if (((local_298.fpclass != cpp_dec_float_NaN) && (local_158.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (&local_248,&local_158), 0 < iVar13)) {
            ::soplex::infinity::__tls_init();
            local_298.fpclass = cpp_dec_float_finite;
            local_298.prec_elem = 0x10;
            local_298.data._M_elems[0] = 0;
            local_298.data._M_elems[1] = 0;
            local_298.data._M_elems[2] = 0;
            local_298.data._M_elems[3] = 0;
            local_298.data._M_elems[4] = 0;
            local_298.data._M_elems[5] = 0;
            local_298.data._M_elems[6] = 0;
            local_298.data._M_elems[7] = 0;
            local_298.data._M_elems[8] = 0;
            local_298.data._M_elems[9] = 0;
            local_298.data._M_elems[10] = 0;
            local_298.data._M_elems[0xb] = 0;
            local_298.data._M_elems[0xc] = 0;
            local_298.data._M_elems[0xd] = 0;
            local_298.data._M_elems._56_5_ = 0;
            local_298.data._M_elems[0xf]._1_3_ = 0;
            local_298.exp = 0;
            local_298.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_298,local_58);
            if (((pcVar1->fpclass != cpp_dec_float_NaN) && (local_298.fpclass != cpp_dec_float_NaN))
               && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                      (pcVar1,&local_298), iVar13 < 0)) goto LAB_0047a651;
          }
        }
      }
      else {
        iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_248,&local_a8);
        if (iVar11 < 1) {
          goto LAB_0047a18f;
        }
        piVar14 = &local_108.prec_elem;
        fVar12 = local_108.fpclass;
        if (local_108.fpclass != cpp_dec_float_NaN && local_248.fpclass != cpp_dec_float_NaN) {
          iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_248,&local_108);
          if (iVar11 < 1) {
            piVar14 = &local_108.prec_elem;
            fVar12 = local_108.fpclass;
          }
          else {
            local_108.data._M_elems[0xc] = local_248.data._M_elems[0xc];
            local_108.data._M_elems[0xd] = local_248.data._M_elems[0xd];
            local_108.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
            local_108.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
            local_108.data._M_elems[8] = local_248.data._M_elems[8];
            local_108.data._M_elems[9] = local_248.data._M_elems[9];
            local_108.data._M_elems[10] = local_248.data._M_elems[10];
            local_108.data._M_elems[0xb] = local_248.data._M_elems[0xb];
            local_108.data._M_elems[4] = local_248.data._M_elems[4];
            local_108.data._M_elems[5] = local_248.data._M_elems[5];
            local_108.data._M_elems[6] = local_248.data._M_elems[6];
            local_108.data._M_elems[7] = local_248.data._M_elems[7];
            local_108.data._M_elems[0] = local_248.data._M_elems[0];
            local_108.data._M_elems[1] = local_248.data._M_elems[1];
            local_108.data._M_elems[2] = local_248.data._M_elems[2];
            local_108.data._M_elems[3] = local_248.data._M_elems[3];
            local_108.exp = local_248.exp;
            local_108.neg = local_248.neg;
            piVar14 = &local_248.prec_elem;
            fVar12 = local_248.fpclass;
          }
        }
        local_108.fpclass = fVar12;
        local_108.prec_elem = *piVar14;
        pcVar1 = &low[iVar13].m_backend;
        local_1f8.fpclass = cpp_dec_float_finite;
        local_1f8.prec_elem = 0x10;
        local_1f8.data._M_elems[0] = 0;
        local_1f8.data._M_elems[1] = 0;
        local_1f8.data._M_elems[2] = 0;
        local_1f8.data._M_elems[3] = 0;
        local_1f8.data._M_elems[4] = 0;
        local_1f8.data._M_elems[5] = 0;
        local_1f8.data._M_elems[6] = 0;
        local_1f8.data._M_elems[7] = 0;
        local_1f8.data._M_elems[8] = 0;
        local_1f8.data._M_elems[9] = 0;
        local_1f8.data._M_elems[10] = 0;
        local_1f8.data._M_elems[0xb] = 0;
        local_1f8.data._M_elems[0xc] = 0;
        local_1f8.data._M_elems[0xd] = 0;
        local_1f8.data._M_elems._56_5_ = 0;
        local_1f8.data._M_elems[0xf]._1_3_ = 0;
        local_1f8.exp = 0;
        local_1f8.neg = false;
        if (&local_1f8 == &vec[iVar13].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_1f8,pcVar1);
          if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
            local_1f8.neg = (bool)(local_1f8.neg ^ 1);
          }
        }
        else {
          if (&local_1f8 != pcVar1) {
            local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_1f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_1f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_1f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_1f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_1f8.data._M_elems._56_5_ = SUB85(uVar3,0);
            local_1f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_1f8.exp = pcVar1->exp;
            local_1f8.neg = pcVar1->neg;
            local_1f8.fpclass = pcVar1->fpclass;
            local_1f8.prec_elem = pcVar1->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_1f8,&vec[iVar13].m_backend);
        }
        local_1a8.fpclass = cpp_dec_float_finite;
        local_1a8.prec_elem = 0x10;
        local_1a8.data._M_elems[0] = 0;
        local_1a8.data._M_elems[1] = 0;
        local_1a8.data._M_elems[2] = 0;
        local_1a8.data._M_elems[3] = 0;
        local_1a8.data._M_elems[4] = 0;
        local_1a8.data._M_elems[5] = 0;
        local_1a8.data._M_elems[6] = 0;
        local_1a8.data._M_elems[7] = 0;
        local_1a8.data._M_elems[8] = 0;
        local_1a8.data._M_elems[9] = 0;
        local_1a8.data._M_elems[10] = 0;
        local_1a8.data._M_elems[0xb] = 0;
        local_1a8.data._M_elems[0xc] = 0;
        local_1a8.data._M_elems[0xd] = 0;
        local_1a8.data._M_elems[0xe] = 0;
        local_1a8.data._M_elems[0xf] = 0;
        local_1a8.exp = 0;
        local_1a8.neg = false;
        if (&local_1a8 == v_00) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_1a8,&local_1f8);
          if (local_1a8.data._M_elems[0] != 0 || local_1a8.fpclass != cpp_dec_float_finite) {
            local_1a8.neg = (bool)(local_1a8.neg ^ 1);
          }
        }
        else {
          local_1a8.data._M_elems[0xc] = local_1f8.data._M_elems[0xc];
          local_1a8.data._M_elems[0xd] = local_1f8.data._M_elems[0xd];
          local_1a8.data._M_elems[0xe] = local_1f8.data._M_elems[0xe];
          local_1a8.data._M_elems[0xf] =
               (uint)(CONCAT35(local_1f8.data._M_elems[0xf]._1_3_,local_1f8.data._M_elems._56_5_) >>
                     0x20);
          local_1a8.data._M_elems[8] = local_1f8.data._M_elems[8];
          local_1a8.data._M_elems[9] = local_1f8.data._M_elems[9];
          local_1a8.data._M_elems[10] = local_1f8.data._M_elems[10];
          local_1a8.data._M_elems[0xb] = local_1f8.data._M_elems[0xb];
          local_1a8.data._M_elems[4] = local_1f8.data._M_elems[4];
          local_1a8.data._M_elems[5] = local_1f8.data._M_elems[5];
          local_1a8.data._M_elems[6] = local_1f8.data._M_elems[6];
          local_1a8.data._M_elems[7] = local_1f8.data._M_elems[7];
          local_1a8.data._M_elems[0] = local_1f8.data._M_elems[0];
          local_1a8.data._M_elems[1] = local_1f8.data._M_elems[1];
          local_1a8.data._M_elems[2] = local_1f8.data._M_elems[2];
          local_1a8.data._M_elems[3] = local_1f8.data._M_elems[3];
          local_1a8.exp = local_1f8.exp;
          local_1a8.neg = local_1f8.neg;
          local_1a8.fpclass = local_1f8.fpclass;
          local_1a8.prec_elem = local_1f8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_1a8,v_00);
        }
        local_298.fpclass = cpp_dec_float_finite;
        local_298.prec_elem = 0x10;
        local_298.data._M_elems[0] = 0;
        local_298.data._M_elems[1] = 0;
        local_298.data._M_elems[2] = 0;
        local_298.data._M_elems[3] = 0;
        local_298.data._M_elems[4] = 0;
        local_298.data._M_elems[5] = 0;
        local_298.data._M_elems[6] = 0;
        local_298.data._M_elems[7] = 0;
        local_298.data._M_elems[8] = 0;
        local_298.data._M_elems[9] = 0;
        local_298.data._M_elems[10] = 0;
        local_298.data._M_elems[0xb] = 0;
        local_298.data._M_elems[0xc] = 0;
        local_298.data._M_elems[0xd] = 0;
        local_298.data._M_elems._56_5_ = 0;
        local_298.data._M_elems[0xf]._1_3_ = 0;
        local_298.exp = 0;
        local_298.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_298,&local_1a8,&local_248);
        local_248.data._M_elems[0xc] = local_298.data._M_elems[0xc];
        local_248.data._M_elems[0xd] = local_298.data._M_elems[0xd];
        local_248.data._M_elems._56_5_ = local_298.data._M_elems._56_5_;
        local_248.data._M_elems[0xf]._1_3_ = local_298.data._M_elems[0xf]._1_3_;
        local_248.data._M_elems[8] = local_298.data._M_elems[8];
        local_248.data._M_elems[9] = local_298.data._M_elems[9];
        local_248.data._M_elems[10] = local_298.data._M_elems[10];
        local_248.data._M_elems[0xb] = local_298.data._M_elems[0xb];
        local_248.data._M_elems[4] = local_298.data._M_elems[4];
        local_248.data._M_elems[5] = local_298.data._M_elems[5];
        local_248.data._M_elems[6] = local_298.data._M_elems[6];
        local_248.data._M_elems[7] = local_298.data._M_elems[7];
        local_248.data._M_elems[0] = local_298.data._M_elems[0];
        local_248.data._M_elems[1] = local_298.data._M_elems[1];
        local_248.data._M_elems[2] = local_298.data._M_elems[2];
        local_248.data._M_elems[3] = local_298.data._M_elems[3];
        local_248.exp = local_298.exp;
        local_248.neg = local_298.neg;
        local_248.fpclass = local_298.fpclass;
        local_248.prec_elem = local_298.prec_elem;
        if (((local_298.fpclass == cpp_dec_float_NaN) || (local_158.fpclass == cpp_dec_float_NaN))
           || (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (&local_248,&local_158), iVar13 < 1)) goto LAB_0047aa69;
        ::soplex::infinity::__tls_init();
        local_298.fpclass = cpp_dec_float_finite;
        local_298.prec_elem = 0x10;
        local_298.data._M_elems[0] = 0;
        local_298.data._M_elems[1] = 0;
        local_298.data._M_elems[2] = 0;
        local_298.data._M_elems[3] = 0;
        local_298.data._M_elems[4] = 0;
        local_298.data._M_elems[5] = 0;
        local_298.data._M_elems[6] = 0;
        local_298.data._M_elems[7] = 0;
        local_298.data._M_elems[8] = 0;
        local_298.data._M_elems[9] = 0;
        local_298.data._M_elems[10] = 0;
        local_298.data._M_elems[0xb] = 0;
        local_298.data._M_elems[0xc] = 0;
        local_298.data._M_elems[0xd] = 0;
        local_298.data._M_elems._56_5_ = 0;
        local_298.data._M_elems[0xf]._1_3_ = 0;
        local_298.exp = 0;
        local_298.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_298,(double)CONCAT44(uStack_44,local_48));
        if (((pcVar1->fpclass == cpp_dec_float_NaN) || (local_298.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (pcVar1,&local_298), iVar13 < 1)) goto LAB_0047aa69;
LAB_0047a651:
        local_158.data._M_elems[1] = local_248.data._M_elems[1];
        local_158.data._M_elems[0] = local_248.data._M_elems[0];
        local_158.data._M_elems[3] = local_248.data._M_elems[3];
        local_158.data._M_elems[2] = local_248.data._M_elems[2];
        local_158.data._M_elems[5] = local_248.data._M_elems[5];
        local_158.data._M_elems[4] = local_248.data._M_elems[4];
        local_158.data._M_elems[7] = local_248.data._M_elems[7];
        local_158.data._M_elems[6] = local_248.data._M_elems[6];
        local_158.data._M_elems[9] = local_248.data._M_elems[9];
        local_158.data._M_elems[8] = local_248.data._M_elems[8];
        local_158.data._M_elems[0xb] = local_248.data._M_elems[0xb];
        local_158.data._M_elems[10] = local_248.data._M_elems[10];
        local_158.data._M_elems[0xd] = local_248.data._M_elems[0xd];
        local_158.data._M_elems[0xc] = local_248.data._M_elems[0xc];
        local_158.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
        local_158.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
        local_158.exp = local_248.exp;
        local_158.neg = local_248.neg;
        local_158.fpclass = local_248.fpclass;
        local_158.prec_elem = local_248.prec_elem;
      }
LAB_0047aa69:
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 0xc) = local_158.data._M_elems._48_8_;
  *(ulong *)((local_b8->m_backend).data._M_elems + 0xe) =
       CONCAT35(local_158.data._M_elems[0xf]._1_3_,local_158.data._M_elems._56_5_);
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 10) = local_158.data._M_elems._40_8_;
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
  *(undefined8 *)(local_b8->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
  (local_b8->m_backend).exp = local_158.exp;
  (local_b8->m_backend).neg = local_158.neg;
  (local_b8->m_backend).fpclass = local_158.fpclass;
  (local_b8->m_backend).prec_elem = local_158.prec_elem;
  return -1;
}

Assistant:

int SPxHarrisRT<R>::minDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
) const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val < 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x > theval && low[i] > R(-infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x > theval && up[i] < R(infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}